

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  bool bVar1;
  int iVar2;
  string *extraout_RAX;
  string *psVar3;
  ostream *poVar4;
  size_t sVar5;
  size_type sVar6;
  Message env_var;
  string full_flag;
  char local_49;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  
  Message::Message((Message *)&local_48);
  sVar5 = 6;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_48.ptr_ + 0x10),"gtest_",6);
  poVar4 = (ostream *)(local_48.ptr_ + 0x10);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar5 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)this,sVar5);
  Message::GetString_abi_cxx11_(&local_40,(Message *)&local_48);
  if (local_48.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = IsTrue(true);
    if ((bVar1) &&
       (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_48.ptr_ + 8))();
    }
  }
  Message::Message((Message *)&local_48);
  if (local_40._M_string_length != 0) {
    sVar6 = 0;
    do {
      iVar2 = toupper((uint)(byte)local_40._M_dataplus._M_p[sVar6]);
      local_49 = (char)iVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_48.ptr_ + 0x10),&local_49,1);
      sVar6 = sVar6 + 1;
    } while (sVar6 != local_40._M_string_length);
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&local_48);
  if (local_48.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = IsTrue(true);
    if ((bVar1) &&
       (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_48.ptr_ + 8))();
    }
  }
  psVar3 = (string *)&local_40.field_2;
  if ((string *)local_40._M_dataplus._M_p != psVar3) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}